

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct32_stage9_sse4_1
               (__m128i *bf1,__m128i *out,int do_cols,int bd,int out_shift,__m128i *clamp_lo,
               __m128i *clamp_hi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __m128i *in;
  int i;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  
  iVar6 = (int)(*bf1)[0];
  iVar8 = *(int *)((long)*bf1 + 4);
  iVar10 = (int)(*bf1)[1];
  iVar12 = *(int *)((long)*bf1 + 0xc);
  iVar1 = (int)bf1[0x1f][0];
  iVar2 = *(int *)((long)bf1[0x1f] + 4);
  iVar3 = (int)bf1[0x1f][1];
  iVar4 = *(int *)((long)bf1[0x1f] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)*out = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)*out + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(*out + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x1f] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x1f] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x1f] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x1f] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[1][0];
  iVar8 = *(int *)((long)bf1[1] + 4);
  iVar10 = (int)bf1[1][1];
  iVar12 = *(int *)((long)bf1[1] + 0xc);
  iVar1 = (int)bf1[0x1e][0];
  iVar2 = *(int *)((long)bf1[0x1e] + 4);
  iVar3 = (int)bf1[0x1e][1];
  iVar4 = *(int *)((long)bf1[0x1e] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[1] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[1] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x1e] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x1e] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x1e] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x1e] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[2][0];
  iVar8 = *(int *)((long)bf1[2] + 4);
  iVar10 = (int)bf1[2][1];
  iVar12 = *(int *)((long)bf1[2] + 0xc);
  iVar1 = (int)bf1[0x1d][0];
  iVar2 = *(int *)((long)bf1[0x1d] + 4);
  iVar3 = (int)bf1[0x1d][1];
  iVar4 = *(int *)((long)bf1[0x1d] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[2] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[2] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x1d] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x1d] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x1d] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x1d] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[3][0];
  iVar8 = *(int *)((long)bf1[3] + 4);
  iVar10 = (int)bf1[3][1];
  iVar12 = *(int *)((long)bf1[3] + 0xc);
  iVar1 = (int)bf1[0x1c][0];
  iVar2 = *(int *)((long)bf1[0x1c] + 4);
  iVar3 = (int)bf1[0x1c][1];
  iVar4 = *(int *)((long)bf1[0x1c] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[3] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[3] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x1c] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x1c] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x1c] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x1c] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[4][0];
  iVar8 = *(int *)((long)bf1[4] + 4);
  iVar10 = (int)bf1[4][1];
  iVar12 = *(int *)((long)bf1[4] + 0xc);
  iVar1 = (int)bf1[0x1b][0];
  iVar2 = *(int *)((long)bf1[0x1b] + 4);
  iVar3 = (int)bf1[0x1b][1];
  iVar4 = *(int *)((long)bf1[0x1b] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[4] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[4] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x1b] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x1b] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x1b] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x1b] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[5][0];
  iVar8 = *(int *)((long)bf1[5] + 4);
  iVar10 = (int)bf1[5][1];
  iVar12 = *(int *)((long)bf1[5] + 0xc);
  iVar1 = (int)bf1[0x1a][0];
  iVar2 = *(int *)((long)bf1[0x1a] + 4);
  iVar3 = (int)bf1[0x1a][1];
  iVar4 = *(int *)((long)bf1[0x1a] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[5] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[5] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x1a] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x1a] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x1a] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x1a] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[6][0];
  iVar8 = *(int *)((long)bf1[6] + 4);
  iVar10 = (int)bf1[6][1];
  iVar12 = *(int *)((long)bf1[6] + 0xc);
  iVar1 = (int)bf1[0x19][0];
  iVar2 = *(int *)((long)bf1[0x19] + 4);
  iVar3 = (int)bf1[0x19][1];
  iVar4 = *(int *)((long)bf1[0x19] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[6] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[6] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x19] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x19] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x19] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x19] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[7][0];
  iVar8 = *(int *)((long)bf1[7] + 4);
  iVar10 = (int)bf1[7][1];
  iVar12 = *(int *)((long)bf1[7] + 0xc);
  iVar1 = (int)bf1[0x18][0];
  iVar2 = *(int *)((long)bf1[0x18] + 4);
  iVar3 = (int)bf1[0x18][1];
  iVar4 = *(int *)((long)bf1[0x18] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[7] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[7] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x18] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x18] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x18] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x18] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[8][0];
  iVar8 = *(int *)((long)bf1[8] + 4);
  iVar10 = (int)bf1[8][1];
  iVar12 = *(int *)((long)bf1[8] + 0xc);
  iVar1 = (int)bf1[0x17][0];
  iVar2 = *(int *)((long)bf1[0x17] + 4);
  iVar3 = (int)bf1[0x17][1];
  iVar4 = *(int *)((long)bf1[0x17] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[8] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[8] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[8] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[8] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x17] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x17] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x17] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x17] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[9][0];
  iVar8 = *(int *)((long)bf1[9] + 4);
  iVar10 = (int)bf1[9][1];
  iVar12 = *(int *)((long)bf1[9] + 0xc);
  iVar1 = (int)bf1[0x16][0];
  iVar2 = *(int *)((long)bf1[0x16] + 4);
  iVar3 = (int)bf1[0x16][1];
  iVar4 = *(int *)((long)bf1[0x16] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[9] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[9] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[9] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[9] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x16] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x16] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x16] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x16] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[10][0];
  iVar8 = *(int *)((long)bf1[10] + 4);
  iVar10 = (int)bf1[10][1];
  iVar12 = *(int *)((long)bf1[10] + 0xc);
  iVar1 = (int)bf1[0x15][0];
  iVar2 = *(int *)((long)bf1[0x15] + 4);
  iVar3 = (int)bf1[0x15][1];
  iVar4 = *(int *)((long)bf1[0x15] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[10] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[10] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[10] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19;
  *(uint *)((long)out[10] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x15] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x15] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x15] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x15] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[0xb][0];
  iVar8 = *(int *)((long)bf1[0xb] + 4);
  iVar10 = (int)bf1[0xb][1];
  iVar12 = *(int *)((long)bf1[0xb] + 0xc);
  iVar1 = (int)bf1[0x14][0];
  iVar2 = *(int *)((long)bf1[0x14] + 4);
  iVar3 = (int)bf1[0x14][1];
  iVar4 = *(int *)((long)bf1[0x14] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[0xb] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0xb] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[0xb] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19
  ;
  *(uint *)((long)out[0xb] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x14] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x14] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x14] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x14] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[0xc][0];
  iVar8 = *(int *)((long)bf1[0xc] + 4);
  iVar10 = (int)bf1[0xc][1];
  iVar12 = *(int *)((long)bf1[0xc] + 0xc);
  iVar1 = (int)bf1[0x13][0];
  iVar2 = *(int *)((long)bf1[0x13] + 4);
  iVar3 = (int)bf1[0x13][1];
  iVar4 = *(int *)((long)bf1[0x13] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[0xc] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0xc] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[0xc] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19
  ;
  *(uint *)((long)out[0xc] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x13] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x13] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x13] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x13] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[0xd][0];
  iVar8 = *(int *)((long)bf1[0xd] + 4);
  iVar10 = (int)bf1[0xd][1];
  iVar12 = *(int *)((long)bf1[0xd] + 0xc);
  iVar1 = (int)bf1[0x12][0];
  iVar2 = *(int *)((long)bf1[0x12] + 4);
  iVar3 = (int)bf1[0x12][1];
  iVar4 = *(int *)((long)bf1[0x12] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[0xd] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0xd] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[0xd] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19
  ;
  *(uint *)((long)out[0xd] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x12] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x12] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x12] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x12] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[0xe][0];
  iVar8 = *(int *)((long)bf1[0xe] + 4);
  iVar10 = (int)bf1[0xe][1];
  iVar12 = *(int *)((long)bf1[0xe] + 0xc);
  iVar1 = (int)bf1[0x11][0];
  iVar2 = *(int *)((long)bf1[0x11] + 4);
  iVar3 = (int)bf1[0x11][1];
  iVar4 = *(int *)((long)bf1[0x11] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[0xe] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0xe] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[0xe] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19
  ;
  *(uint *)((long)out[0xe] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x11] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x11] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x11] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x11] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  iVar6 = (int)bf1[0xf][0];
  iVar8 = *(int *)((long)bf1[0xf] + 4);
  iVar10 = (int)bf1[0xf][1];
  iVar12 = *(int *)((long)bf1[0xf] + 0xc);
  iVar1 = (int)bf1[0x10][0];
  iVar2 = *(int *)((long)bf1[0x10] + 4);
  iVar3 = (int)bf1[0x10][1];
  iVar4 = *(int *)((long)bf1[0x10] + 0xc);
  iVar14 = iVar1 + iVar6;
  iVar16 = iVar2 + iVar8;
  iVar18 = iVar3 + iVar10;
  iVar20 = iVar4 + iVar12;
  iVar6 = iVar6 - iVar1;
  iVar8 = iVar8 - iVar2;
  iVar10 = iVar10 - iVar3;
  iVar12 = iVar12 - iVar4;
  iVar1 = (int)(*clamp_lo)[0];
  iVar2 = *(int *)((long)*clamp_lo + 4);
  iVar3 = (int)(*clamp_lo)[1];
  iVar4 = *(int *)((long)*clamp_lo + 0xc);
  uVar15 = (uint)(iVar14 < iVar1) * iVar1 | (uint)(iVar14 >= iVar1) * iVar14;
  uVar17 = (uint)(iVar16 < iVar2) * iVar2 | (uint)(iVar16 >= iVar2) * iVar16;
  uVar19 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar21 = (uint)(iVar20 < iVar4) * iVar4 | (uint)(iVar20 >= iVar4) * iVar20;
  iVar14 = (int)(*clamp_hi)[0];
  iVar16 = *(int *)((long)*clamp_hi + 4);
  iVar18 = (int)(*clamp_hi)[1];
  iVar20 = *(int *)((long)*clamp_hi + 0xc);
  uVar7 = (uint)(iVar6 < iVar1) * iVar1 | (uint)(iVar6 >= iVar1) * iVar6;
  uVar9 = (uint)(iVar8 < iVar2) * iVar2 | (uint)(iVar8 >= iVar2) * iVar8;
  uVar11 = (uint)(iVar10 < iVar3) * iVar3 | (uint)(iVar10 >= iVar3) * iVar10;
  uVar13 = (uint)(iVar12 < iVar4) * iVar4 | (uint)(iVar12 >= iVar4) * iVar12;
  *(uint *)out[0xf] = (uint)(iVar14 < (int)uVar15) * iVar14 | (iVar14 >= (int)uVar15) * uVar15;
  *(uint *)((long)out[0xf] + 4) =
       (uint)(iVar16 < (int)uVar17) * iVar16 | (iVar16 >= (int)uVar17) * uVar17;
  *(uint *)(out[0xf] + 1) = (uint)(iVar18 < (int)uVar19) * iVar18 | (iVar18 >= (int)uVar19) * uVar19
  ;
  *(uint *)((long)out[0xf] + 0xc) =
       (uint)(iVar20 < (int)uVar21) * iVar20 | (iVar20 >= (int)uVar21) * uVar21;
  *(uint *)out[0x10] = (uint)(iVar14 < (int)uVar7) * iVar14 | (iVar14 >= (int)uVar7) * uVar7;
  *(uint *)((long)out[0x10] + 4) =
       (uint)(iVar16 < (int)uVar9) * iVar16 | (iVar16 >= (int)uVar9) * uVar9;
  *(uint *)(out[0x10] + 1) =
       (uint)(iVar18 < (int)uVar11) * iVar18 | (iVar18 >= (int)uVar11) * uVar11;
  *(uint *)((long)out[0x10] + 0xc) =
       (uint)(iVar20 < (int)uVar13) * iVar20 | (iVar20 >= (int)uVar13) * uVar13;
  if (do_cols == 0) {
    iVar6 = 10;
    if (10 < bd) {
      iVar6 = bd;
    }
    iVar6 = 0x20 << ((byte)iVar6 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar6;
    clamp_hi_out[0]._0_4_ = iVar6 + -1;
    in = out;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    for (uVar5 = 0; uVar5 < 0x20; uVar5 = uVar5 + 8) {
      round_shift_4x4(in,out_shift);
      round_shift_4x4(in + 4,out_shift);
      in = in + 8;
    }
    highbd_clamp_epi32_sse4_1(out,out,&clamp_lo_out,&clamp_hi_out,0x20);
  }
  return;
}

Assistant:

static inline void idct32_stage9_sse4_1(__m128i *bf1, __m128i *out,
                                        const int do_cols, const int bd,
                                        const int out_shift,
                                        const __m128i *clamp_lo,
                                        const __m128i *clamp_hi) {
  addsub_sse4_1(bf1[0], bf1[31], out + 0, out + 31, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[1], bf1[30], out + 1, out + 30, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[2], bf1[29], out + 2, out + 29, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[3], bf1[28], out + 3, out + 28, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[4], bf1[27], out + 4, out + 27, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[5], bf1[26], out + 5, out + 26, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[6], bf1[25], out + 6, out + 25, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[7], bf1[24], out + 7, out + 24, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[8], bf1[23], out + 8, out + 23, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[9], bf1[22], out + 9, out + 22, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[10], bf1[21], out + 10, out + 21, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[11], bf1[20], out + 11, out + 20, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[12], bf1[19], out + 12, out + 19, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[13], bf1[18], out + 13, out + 18, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[14], bf1[17], out + 14, out + 17, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[15], bf1[16], out + 15, out + 16, clamp_lo, clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    for (int i = 0; i < 32; i += 8) {
      round_shift_4x4(out + i, out_shift);
      round_shift_4x4(out + i + 4, out_shift);
    }
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 32);
  }
}